

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitStringTest_x_iutest_x_FormatSizeTByte_Test::Body
          (iu_UnitStringTest_x_iutest_x_FormatSizeTByte_Test *this)

{
  UInt64 in_RDX;
  UInt64 extraout_RDX;
  UInt64 extraout_RDX_00;
  UInt64 extraout_RDX_01;
  UInt64 extraout_RDX_02;
  UInt64 value;
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffdc8;
  AssertionResult local_230;
  AssertionHelper local_208;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [392];
  
  iutest::detail::FormatSizeByte_abi_cxx11_(&local_1b8,(detail *)0x10000000000,in_RDX);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_230,(internal *)"\"1TB\"",
             "::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024)","1TB",
             (char *)&local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdc8);
  value = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    value = extraout_RDX_00;
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdcf);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x113;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    value = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != &local_230.m_message.field_2) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
    value = extraout_RDX_02;
  }
  iutest::detail::FormatSizeByte_abi_cxx11_(&local_1d8,(detail *)0x4000000000000,value);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&local_230,(internal *)"\"1024TB\"",
             "::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024 * 1024)","1024TB",
             (char *)&local_1d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdc8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffdcf);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x114;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != &local_230.m_message.field_2) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, FormatSizeTByte)
{
    IUTEST_EXPECT_STREQ("1TB", ::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024));
    IUTEST_EXPECT_STREQ("1024TB", ::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024 * 1024));
}